

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O3

void __thiscall Diligent::DeviceContextVkImpl::EndRenderScope(DeviceContextVkImpl *this)

{
  RenderingInfoWrapper *pRVar1;
  string msg;
  string local_30;
  
  pRVar1 = (this->m_DynamicRenderingInfo)._M_t.
           super___uniq_ptr_impl<VulkanUtilities::RenderingInfoWrapper,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
           ._M_t.
           super__Tuple_impl<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_std::default_delete<VulkanUtilities::RenderingInfoWrapper>_>
           .super__Head_base<0UL,_VulkanUtilities::RenderingInfoWrapper_*,_false>._M_head_impl;
  if ((pRVar1 != (RenderingInfoWrapper *)0x0) && (pRVar1->m_AttachmentClearMask != 0)) {
    if ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0) {
      FormatString<char[83]>
                (&local_30,
                 (char (*) [83])
                 "Command buffer must not be in a dynamic render scope when there are pending clears"
                );
      DebugAssertionFailed
                (local_30._M_dataplus._M_p,"EndRenderScope",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0x7b3);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    EnsureVkCmdBuffer(this);
    CommitRenderPassAndFramebuffer(this,false);
  }
  if ((this->m_CommandBuffer).m_VkCmdBuffer != (VkCommandBuffer)0x0) {
    if ((this->m_CommandBuffer).m_State.RenderPass == (VkRenderPass)0x0) {
      if ((this->m_CommandBuffer).m_State.DynamicRenderingHash != 0) {
        VulkanUtilities::VulkanCommandBuffer::EndRendering(&this->m_CommandBuffer);
      }
    }
    else {
      VulkanUtilities::VulkanCommandBuffer::EndRenderPass(&this->m_CommandBuffer);
    }
  }
  return;
}

Assistant:

void DeviceContextVkImpl::EndRenderScope()
{
    if (m_DynamicRenderingInfo && m_DynamicRenderingInfo->HasClears())
    {
        VERIFY(m_CommandBuffer.GetState().DynamicRenderingHash == 0, "Command buffer must not be in a dynamic render scope when there are pending clears");
        EnsureVkCmdBuffer();
        // Apply clears
        CommitRenderPassAndFramebuffer(/*VerifyStates = */ false);
    }

    if (m_CommandBuffer.GetVkCmdBuffer() != VK_NULL_HANDLE)
    {
        m_CommandBuffer.EndRenderScope();
    }
}